

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.cxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::cluster_config::serialize(cluster_config *this)

{
  bool bVar1;
  long lVar2;
  element_type *peVar3;
  buffer *this_00;
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer *in_RSI;
  element_type *in_RDI;
  buffer *this_01;
  ptr<buffer> pVar5;
  size_t i;
  ptr<buffer> buf;
  const_iterator it;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  srv_buffs;
  size_t sz;
  ptr<buffer> *result;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *in_stack_ffffffffffffff48;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff58;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *in_stack_ffffffffffffff60;
  srv_config *in_stack_ffffffffffffff78;
  int32 val;
  element_type *ba;
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *buf_00;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  _Self local_40;
  _Self local_38;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_30;
  long local_18;
  
  local_18 = 0x15;
  ba = in_RDI;
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          *)0x28fd1a);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
       ::cbegin(in_stack_ffffffffffffff48);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         ::cend(in_stack_ffffffffffffff48);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
              ((_List_const_iterator<std::shared_ptr<nuraft::srv_config>_> *)
               in_stack_ffffffffffffff50);
    std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28fd73);
    srv_config::serialize(in_stack_ffffffffffffff78);
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    peVar3 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x28fda0);
    in_stack_ffffffffffffff78 = (srv_config *)nuraft::buffer::size(peVar3);
    local_18 = (long)&in_stack_ffffffffffffff78->id_ + local_18;
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x28fdce);
    std::_List_const_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++(&local_38);
  }
  local_18 = local_18 + 4;
  lVar2 = std::__cxx11::string::size();
  local_18 = local_18 + lVar2;
  in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 & 0xffffff;
  nuraft::buffer::alloc
            ((size_t)srv_buffs.
                     super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x28fe6b);
  nuraft::buffer::put(in_RDI,(ulong)in_stack_ffffffffffffff78);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x28fe87);
  nuraft::buffer::put(in_RDI,(ulong)in_stack_ffffffffffffff78);
  val = (int32)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x28fea4);
  nuraft::buffer::put(in_RDI,(byte)((uint)val >> 0x18));
  peVar3 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x28fec4);
  this_01 = in_RSI + 0x18;
  this_00 = (buffer *)std::__cxx11::string::data();
  std::__cxx11::string::size();
  nuraft::buffer::put(in_RSI,(byte *)ba,(size_t)in_RDI);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x28ff09);
  std::__cxx11::
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>::
  size(in_stack_ffffffffffffff50);
  nuraft::buffer::put(in_RDI,val);
  this_02 = (__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x0;
  while (buf_00 = this_02,
        p_Var4 = (__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::
                 vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 ::size(&local_30), this_02 < p_Var4) {
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28ff61);
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::operator[](&local_30,(size_type)buf_00);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              (this_02);
    nuraft::buffer::put((buffer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (buffer *)buf_00);
    this_02 = (__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              ((buffer *)buf_00 + 1);
  }
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x28ffc3);
  nuraft::buffer::pos(this_00,(size_t)peVar3);
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  ~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
           *)this_01);
  pVar5.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar5.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = ba;
  return (ptr<buffer>)pVar5.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> cluster_config::serialize() const {
    size_t sz = 2 * sz_ulong + sz_int + sz_byte;
    std::vector<ptr<buffer>> srv_buffs;
    for (auto it = servers_.cbegin(); it != servers_.cend(); ++it) {
        ptr<buffer> buf = (*it)->serialize();
        srv_buffs.push_back(buf);
        sz += buf->size();
    }
    // For aux string.
    sz += sz_int;
    sz += user_ctx_.size();

    ptr<buffer> result = buffer::alloc(sz);
    result->put(log_idx_);
    result->put(prev_log_idx_);
    result->put((byte)(async_replication_ ? 1 : 0));
    result->put((byte*)user_ctx_.data(), user_ctx_.size());
    result->put((int32)servers_.size());
    for (size_t i = 0; i < srv_buffs.size(); ++i) {
        result->put(*srv_buffs[i]);
    }

    result->pos(0);
    return result;
}